

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_load.cpp
# Opt level: O0

bool __thiscall FScriptLoader::ParseInfo(FScriptLoader *this,MapData *map)

{
  byte bVar1;
  level_info_t *this_00;
  DFraggleThinker *pDVar2;
  char *pcVar3;
  DFsScript *pDVar4;
  byte local_a9;
  FName local_6c;
  FFsOptions *local_68;
  FFsOptions *opt;
  uint local_58;
  int lumpnum;
  FString local_48;
  FString scriptsrc;
  bool fsglobal;
  char *pcStack_38;
  int lumpsize;
  char *startofline;
  char *rover;
  char *lump;
  MapData *map_local;
  FScriptLoader *this_local;
  
  scriptsrc.Chars._3_1_ = 0;
  FString::FString(&local_48);
  this->IgnoreInfo = false;
  scriptsrc.Chars._4_4_ = MapData::Size(map,0);
  if (scriptsrc.Chars._4_4_ == 0) {
    local_58 = FWadCollection::CheckNumForName(&Wads,"FSGLOBAL");
    if ((int)local_58 < 0) {
      this_local._7_1_ = false;
      goto LAB_008f78ce;
    }
    scriptsrc.Chars._4_4_ = FWadCollection::LumpLength(&Wads,local_58);
    if (scriptsrc.Chars._4_4_ == 0) {
      this_local._7_1_ = false;
      scriptsrc.Chars._4_4_ = 0;
      goto LAB_008f78ce;
    }
    scriptsrc.Chars._3_1_ = 1;
    rover = (char *)operator_new__((long)(int)(scriptsrc.Chars._4_4_ + 3));
    pcVar3 = (char *)(ulong)local_58;
    FWadCollection::ReadLump(&Wads,local_58,rover);
  }
  else {
    rover = (char *)operator_new__((long)(int)(scriptsrc.Chars._4_4_ + 3));
    pcVar3 = (char *)0x0;
    MapData::Read(map,0,rover,-1);
  }
  rover[(int)scriptsrc.Chars._4_4_] = '\n';
  rover[(int)(scriptsrc.Chars._4_4_ + 1)] = '\r';
  rover[(int)(scriptsrc.Chars._4_4_ + 2)] = '\0';
  scriptsrc.Chars._4_4_ = scriptsrc.Chars._4_4_ + 2;
  pcStack_38 = rover;
  startofline = rover;
  this->HasScripts = false;
  this->drownflag = -1;
  this->readtype = RT_OTHER;
  for (; startofline < rover + (int)scriptsrc.Chars._4_4_; startofline = startofline + 1) {
    if (*startofline == '\n') {
      *startofline = '\0';
      if ((this->IgnoreInfo & 1U) == 0) {
        ParseInfoCmd(this,pcStack_38,&local_48);
        pcVar3 = pcStack_38;
      }
      pcStack_38 = startofline + 1;
      *startofline = '\n';
    }
  }
  if ((this->HasScripts & 1U) != 0) {
    pDVar2 = (DFraggleThinker *)DObject::operator_new((DObject *)0x60,(size_t)pcVar3);
    DFraggleThinker::DFraggleThinker(pDVar2);
    pcVar3 = FString::GetChars(&local_48);
    pcVar3 = copystring(pcVar3);
    pDVar2 = TObjPtr<DFraggleThinker>::operator->(&DFraggleThinker::ActiveThinker);
    pDVar4 = TObjPtr<DFsScript>::operator->(&pDVar2->LevelScript);
    pDVar4->data = pcVar3;
    if (this->drownflag == -1) {
      local_a9 = 1;
      if (::level.maptype == MAPTYPE_DOOM) {
        local_a9 = scriptsrc.Chars._3_1_;
      }
      this->drownflag = (uint)(local_a9 & 1);
    }
    this_00 = ::level.info;
    if (this->drownflag == 0) {
      ::level.airsupply = 0;
    }
    FName::FName(&local_6c,"fragglescript");
    local_68 = level_info_t::GetOptData<FFsOptions>(this_00,&local_6c,false);
    if (local_68 != (FFsOptions *)0x0) {
      bVar1 = (local_68->super_FOptionalMapinfoData).field_0x14;
      pDVar2 = TObjPtr<DFraggleThinker>::operator->(&DFraggleThinker::ActiveThinker);
      pDVar2->nocheckposition = (bool)(bVar1 & 1);
    }
  }
  if (rover != (char *)0x0) {
    operator_delete__(rover);
  }
  this_local._7_1_ = (bool)(this->HasScripts & 1);
LAB_008f78ce:
  opt._4_4_ = 1;
  FString::~FString(&local_48);
  return this_local._7_1_;
}

Assistant:

bool FScriptLoader::ParseInfo(MapData * map)
{
	char *lump;
	char *rover;
	char *startofline;
	int lumpsize;
	bool fsglobal=false;
	FString scriptsrc;

	// Global initializazion if not done yet.
	static bool done=false;
					
	// Load the script lump
	IgnoreInfo = false;
	lumpsize = map->Size(0);
	if (lumpsize==0)
	{
		// Try a global FS lump
		int lumpnum=Wads.CheckNumForName("FSGLOBAL");
		if (lumpnum<0) return false;
		lumpsize=Wads.LumpLength(lumpnum);
		if (lumpsize==0) return false;
		fsglobal=true;
		lump=new char[lumpsize+3];
		Wads.ReadLump(lumpnum,lump);
	}
	else
	{
		lump=new char[lumpsize+3];
		map->Read(0, lump);
	}
	// Append a new line. The parser likes to crash when the last character is a valid token.
	lump[lumpsize]='\n';
	lump[lumpsize+1]='\r';
	lump[lumpsize+2]=0;
	lumpsize+=2;
	
	rover = startofline = lump;
	HasScripts=false;
	drownflag=-1;

	readtype = RT_OTHER;
	while(rover < lump+lumpsize)
    {
		if(*rover == '\n') // end of line
		{
			*rover = 0;               // make it an end of string (0)
			if (!IgnoreInfo) ParseInfoCmd(startofline, scriptsrc);
			startofline = rover+1; // next line
			*rover = '\n';            // back to end of line
		}
		rover++;
    }
	if (HasScripts) 
	{
		new DFraggleThinker;
		DFraggleThinker::ActiveThinker->LevelScript->data = copystring(scriptsrc.GetChars());

		if (drownflag==-1) drownflag = (level.maptype != MAPTYPE_DOOM || fsglobal);
		if (!drownflag) level.airsupply=0;	// Legacy doesn't to water damage so we need to check if it has to be disabled here.

		FFsOptions *opt = level.info->GetOptData<FFsOptions>("fragglescript", false);
		if (opt != NULL)
		{
			DFraggleThinker::ActiveThinker->nocheckposition = opt->nocheckposition;
		}
	}


	delete[] lump;
	return HasScripts;
}